

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O1

void __thiscall dlib::directory::directory(directory *this,char *name)

{
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  (this->state).name._M_dataplus._M_p = (pointer)&(this->state).name.field_2;
  (this->state).name._M_string_length = 0;
  (this->state).name.field_2._M_local_buf[0] = '\0';
  (this->state).full_name._M_dataplus._M_p = (pointer)&(this->state).full_name.field_2;
  (this->state).full_name._M_string_length = 0;
  (this->state).full_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_30,name,&local_31);
  init(this,(EVP_PKEY_CTX *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

directory (
            const char* name
        ) { init(name); }